

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_sig_deserialize
              (secp256k1_ge *r,secp256k1_scalar *sigr,secp256k1_ge *rp,secp256k1_scalar *sp,
              secp256k1_scalar *dleq_proof_e,secp256k1_scalar *dleq_proof_s,uchar *adaptor_sig162)

{
  int iVar1;
  undefined4 extraout_EAX;
  undefined1 auVar2 [16];
  int overflow_1;
  int overflow;
  int local_38;
  int local_34;
  
  if ((r == (secp256k1_ge *)0x0) ||
     (iVar1 = secp256k1_eckey_pubkey_parse(r,adaptor_sig162,0x21), iVar1 != 0)) {
    if (sigr != (secp256k1_scalar *)0x0) {
      secp256k1_scalar_set_b32(sigr,adaptor_sig162 + 1,(int *)0x0);
      auVar2._0_4_ = -(uint)((int)sigr->d[2] == 0 && (int)sigr->d[0] == 0);
      auVar2._4_4_ = -(uint)(*(int *)((long)sigr->d + 0x14) == 0 && *(int *)((long)sigr->d + 4) == 0
                            );
      auVar2._8_4_ = -(uint)((int)sigr->d[3] == 0 && (int)sigr->d[1] == 0);
      auVar2._12_4_ =
           -(uint)(*(int *)((long)sigr->d + 0x1c) == 0 && *(int *)((long)sigr->d + 0xc) == 0);
      iVar1 = movmskps(extraout_EAX,auVar2);
      if (iVar1 == 0xf) {
        return 0;
      }
    }
    if ((rp == (secp256k1_ge *)0x0) ||
       (iVar1 = secp256k1_eckey_pubkey_parse(rp,adaptor_sig162 + 0x21,0x21), iVar1 != 0)) {
      if (sp != (secp256k1_scalar *)0x0) {
        secp256k1_scalar_set_b32(sp,adaptor_sig162 + 0x42,&local_34);
        if (local_34 != 0) {
          return 0;
        }
        if ((sp->d[3] == 0 && sp->d[1] == 0) && (sp->d[2] == 0 && sp->d[0] == 0)) {
          return 0;
        }
      }
      if (dleq_proof_e != (secp256k1_scalar *)0x0) {
        secp256k1_scalar_set_b32(dleq_proof_e,adaptor_sig162 + 0x62,(int *)0x0);
      }
      if ((dleq_proof_s == (secp256k1_scalar *)0x0) ||
         (secp256k1_scalar_set_b32(dleq_proof_s,adaptor_sig162 + 0x82,&local_38), local_38 == 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int secp256k1_ecdsa_adaptor_sig_deserialize(secp256k1_ge *r, secp256k1_scalar *sigr, secp256k1_ge *rp, secp256k1_scalar *sp, secp256k1_scalar *dleq_proof_e, secp256k1_scalar *dleq_proof_s, const unsigned char *adaptor_sig162) {
    /* If r is deserialized, require that a sigr is provided to receive
     * the X-coordinate */
    VERIFY_CHECK((r == NULL) || (r != NULL && sigr != NULL));
    if (r != NULL) {
        if (!secp256k1_eckey_pubkey_parse(r, &adaptor_sig162[0], 33)) {
            return 0;
        }
    }
    if (sigr != NULL) {
        secp256k1_scalar_set_b32(sigr, &adaptor_sig162[1], NULL);
        if (secp256k1_scalar_is_zero(sigr)) {
            return 0;
        }
    }
    if (rp != NULL) {
        if (!secp256k1_eckey_pubkey_parse(rp, &adaptor_sig162[33], 33)) {
            return 0;
        }
    }
    if (sp != NULL) {
        if (!secp256k1_scalar_set_b32_seckey(sp, &adaptor_sig162[66])) {
            return 0;
        }
    }
    if (dleq_proof_e != NULL) {
        secp256k1_scalar_set_b32(dleq_proof_e, &adaptor_sig162[98], NULL);
    }
    if (dleq_proof_s != NULL) {
        int overflow;
        secp256k1_scalar_set_b32(dleq_proof_s, &adaptor_sig162[130], &overflow);
        if (overflow) {
            return 0;
        }
    }
    return 1;
}